

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

HTTP_HEADERS_RESULT
addUserAgentHeaderInfo
          (HTTPTRANSPORT_HANDLE_DATA *transport_data,HTTP_HEADERS_HANDLE eventHTTPrequestHeaders)

{
  char *value;
  char *product_info;
  HTTP_HEADERS_RESULT result;
  HTTP_HEADERS_HANDLE eventHTTPrequestHeaders_local;
  HTTPTRANSPORT_HANDLE_DATA *transport_data_local;
  
  value = (*(transport_data->transport_callbacks).prod_info_cb)(transport_data->transport_ctx);
  if (value == (char *)0x0) {
    product_info._4_4_ =
         HTTPHeaders_AddHeaderNameValuePair
                   (eventHTTPrequestHeaders,"User-Agent","iothubclient/1.15.0");
  }
  else {
    product_info._4_4_ =
         HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders,"User-Agent",value);
  }
  return product_info._4_4_;
}

Assistant:

static HTTP_HEADERS_RESULT addUserAgentHeaderInfo(HTTPTRANSPORT_HANDLE_DATA* transport_data, HTTP_HEADERS_HANDLE eventHTTPrequestHeaders)
{
    HTTP_HEADERS_RESULT result;
    const char* product_info = transport_data->transport_callbacks.prod_info_cb(transport_data->transport_ctx);
    if (product_info == NULL)
    {
        result = HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders, "User-Agent", CLIENT_DEVICE_TYPE_PREFIX CLIENT_DEVICE_BACKSLASH IOTHUB_SDK_VERSION);
    }
    else
    {
        result = HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders, "User-Agent", product_info);
    }
    return result;
}